

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorLineEdit.cpp
# Opt level: O1

void __thiscall QColorLineEditPrivate::textEdited(QColorLineEditPrivate *this,QString *text)

{
  QColorAction *this_00;
  QIcon *this_01;
  QColor QVar1;
  QColor color;
  undefined1 auStack_38 [8];
  QColorAction local_30;
  
  this_01 = (QIcon *)auStack_38;
  QColor::setNamedColor((QString *)&local_30.d);
  this_00 = this->action;
  if ((int)local_30.d == 0) {
    QVar1 = QColorAction::color(this_00);
    local_30._0_8_ = QVar1._0_8_;
    local_30._8_4_ = QVar1.ct._4_4_;
    local_30._12_2_ = QVar1.ct._8_2_;
    QColorAction::colorIcon((QColorAction *)auStack_38,(QColor *)this_00);
    QAction::setIcon((QIcon *)this_00);
  }
  else {
    QColorAction::colorIcon((QColorAction *)(auStack_38 + 8),(QColor *)this_00);
    QAction::setIcon((QIcon *)this_00);
    this_01 = (QIcon *)(auStack_38 + 8);
  }
  QIcon::~QIcon(this_01);
  return;
}

Assistant:

void textEdited(const QString &text) {
        const QColor color = QColor(text);

        if (color.isValid()) {
            action->setIcon(action->colorIcon(color));
        } else {
            action->setIcon(action->colorIcon(action->color()));
        }
    }